

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.c
# Opt level: O1

void nn_sha1_add(nn_sha1 *self,uint8_t data)

{
  uint32_t uVar1;
  uint uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint8_t uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint32_t uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint32_t uVar15;
  uint uVar16;
  int iVar17;
  uint32_t uVar18;
  
  uVar2._0_1_ = self->buffer_offset;
  uVar2._1_1_ = self->is_little_endian;
  uVar2._2_2_ = *(undefined2 *)&self->field_0x5a;
  uVar8 = (uint)((undefined1)uVar2 ^ 3);
  if (self->is_little_endian == '\0') {
    uVar8 = uVar2;
  }
  *(uint8_t *)((long)self->buffer + (ulong)(uVar8 & 0xff)) = data;
  uVar7 = self->buffer_offset + '\x01';
  self->buffer_offset = uVar7;
  if (uVar7 == '@') {
    uVar1 = self->state[0];
    uVar2 = self->state[1];
    uVar3 = self->state[2];
    uVar4 = self->state[3];
    uVar5 = self->state[4];
    uVar9 = 0;
    uVar15 = uVar5;
    uVar6 = uVar4;
    uVar11 = uVar3;
    uVar8 = uVar2;
    uVar18 = uVar1;
    do {
      uVar16 = uVar18;
      uVar14 = uVar11;
      uVar12 = uVar6;
      if (0xf < uVar9) {
        uVar13 = uVar9 & 0xf;
        uVar10 = self->buffer[uVar13 ^ 8] ^ self->buffer[uVar9 + 0xd & 0xf] ^
                 self->buffer[uVar9 + 2 & 0xf] ^ self->buffer[uVar13];
        self->buffer[uVar13] = uVar10 << 1 | (uint)((int)uVar10 < 0);
      }
      if (uVar9 < 0x14) {
        iVar17 = ((uVar12 ^ uVar14) & uVar8 ^ uVar12) + 0x5a827999;
      }
      else if (uVar9 < 0x28) {
        iVar17 = (uVar12 ^ uVar14 ^ uVar8) + 0x6ed9eba1;
      }
      else if (uVar9 < 0x3c) {
        iVar17 = ((uVar14 | uVar8) & uVar12 | uVar14 & uVar8) + 0x8f1bbcdc;
      }
      else {
        iVar17 = (uVar12 ^ uVar14 ^ uVar8) + 0xca62c1d6;
      }
      uVar18 = uVar15 + (uVar16 << 5 | uVar16 >> 0x1b) + iVar17 + self->buffer[uVar9 & 0xf];
      uVar11 = uVar8 << 0x1e | uVar8 >> 2;
      uVar9 = uVar9 + 1;
      uVar15 = uVar12;
      uVar6 = uVar14;
      uVar8 = uVar16;
    } while (uVar9 != 0x50);
    self->state[0] = uVar18 + uVar1;
    self->state[1] = uVar16 + uVar2;
    self->state[2] = uVar11 + uVar3;
    self->state[3] = uVar14 + uVar4;
    self->state[4] = uVar12 + uVar5;
    self->buffer_offset = '\0';
  }
  return;
}

Assistant:

static void nn_sha1_add (struct nn_sha1 *self, uint8_t data)
{
    uint8_t i;
    uint32_t a, b, c, d, e, t;
    uint8_t * const buf = (uint8_t*) self->buffer;

    if (self->is_little_endian)
        buf [self->buffer_offset ^ 3] = data;
    else
        buf [self->buffer_offset] = data;

    self->buffer_offset++;
    if (self->buffer_offset == SHA1_BLOCK_LEN) {
        a = self->state [0];
        b = self->state [1];
        c = self->state [2];
        d = self->state [3];
        e = self->state [4];
        for (i = 0; i < 80; i++) {
            if (i >= 16) {
                t = self->buffer [(i + 13) & 15] ^
                    self->buffer [(i + 8) & 15] ^
                    self->buffer [(i + 2) & 15] ^
                    self->buffer [i & 15];
                self->buffer [i & 15] = sha1_rol32 (t, 1);
            }

            if (i < 20)
                t = (d ^ (b & (c ^ d))) + 0x5A827999;
            else if (i < 40)
                t = (b ^ c ^ d) + 0x6ED9EBA1;
            else if (i < 60)
                t = ((b & c) | (d & (b | c))) + 0x8F1BBCDC;
            else
                t = (b ^ c ^ d) + 0xCA62C1D6;

            t += sha1_rol32 (a, 5) + e + self->buffer [i & 15];
            e = d;
            d = c;
            c = sha1_rol32 (b, 30);
            b = a;
            a = t;
        }

        self->state [0] += a;
        self->state [1] += b;
        self->state [2] += c;
        self->state [3] += d;
        self->state [4] += e;

        self->buffer_offset = 0;
    }
}